

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O3

QDataStream * operator>>(QDataStream *ds,QTimeZone *tz)

{
  Data DVar1;
  qint32 qVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  QDataStream *pQVar6;
  QTimeZonePrivate *pQVar7;
  qsizetype objectSize;
  long in_FS_OFFSET;
  QLatin1StringView rhs;
  QStringView rhs_00;
  QLatin1StringView rhs_01;
  QLatin1StringView rhs_02;
  QLatin1StringView rhs_03;
  QStringView lhs;
  QStringView lhs_00;
  QStringView lhs_01;
  QStringView lhs_02;
  QStringView lhs_03;
  int territory;
  int utcOffset;
  int utcOffset_1;
  Data local_c8 [3];
  Data local_b0;
  QString local_a8;
  qint32 local_8c;
  Data local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  Data local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  qint32 local_4c;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (storage_type_conflict *)0x0;
  local_48.d.size = 0;
  operator>>(ds,&local_48);
  switch(local_48.d.size) {
  case 0xc:
    rhs.m_data = "AheadOfUtcBy";
    rhs.m_size = 0xc;
    lhs.m_data = local_48.d.ptr;
    lhs.m_size = 0xc;
    bVar3 = QtPrivate::equalStrings(lhs,rhs);
    if (bVar3) {
      local_88._0_4_ = 0xaaaaaaaa;
      QDataStream::operator>>(ds,(qint32 *)&local_88);
      lVar5 = (long)(int)local_88._0_4_;
      pQVar7 = (QTimeZonePrivate *)0x0;
      if (lVar5 + 0xe100U < 0x1c201) {
        pQVar7 = (QTimeZonePrivate *)((3 - (ulong)(lVar5 == 0)) + lVar5 * 4);
      }
      local_68.s = *(ShortData *)&tz->d;
      (tz->d).d = pQVar7;
LAB_00351ade:
      QTimeZone::~QTimeZone((QTimeZone *)&local_68.s);
      goto LAB_00351cb5;
    }
    break;
  case 0xd:
    rhs_03.m_data = "OffsetFromUtc";
    rhs_03.m_size = 0xd;
    lhs_03.m_data = local_48.d.ptr;
    lhs_03.m_size = 0xd;
    bVar3 = QtPrivate::equalStrings(lhs_03,rhs_03);
    if (!bVar3) break;
    local_4c = -0x55555556;
    local_58 = 0;
    local_68.d = (QTimeZonePrivate *)0x0;
    uStack_60 = 0;
    local_78 = 0;
    local_88.d = (QTimeZonePrivate *)0x0;
    uStack_80 = 0;
    local_8c = -0x55555556;
    local_a8.d.size = 0;
    local_a8.d.d = (Data *)0x0;
    local_a8.d.ptr = (char16_t *)0x0;
    pQVar6 = operator>>(ds,&local_48);
    pQVar6 = QDataStream::operator>>(pQVar6,&local_4c);
    pQVar6 = operator>>(pQVar6,(QString *)&local_68.s);
    pQVar6 = operator>>(pQVar6,(QString *)&local_88.s);
    pQVar6 = QDataStream::operator>>(pQVar6,&local_8c);
    operator>>(pQVar6,&local_a8);
    QString::toUtf8_helper((QByteArray *)&local_c8[0].data,&local_48);
    QTimeZone::QTimeZone((QTimeZone *)&local_b0.s,(QByteArray *)&local_c8[0].data);
    DVar1.s = *(ShortData *)&tz->d;
    tz->d = local_b0;
    local_b0.s = DVar1.s;
    QTimeZone::~QTimeZone((QTimeZone *)&local_b0.s);
    if (local_c8[0].d != (QDateTimePrivate *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&(local_c8[0].d)->super_QSharedData)->_q_value).super___atomic_base<int>.
      _M_i = (((QBasicAtomicInt *)&(local_c8[0].d)->super_QSharedData)->_q_value).
             super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&(local_c8[0].d)->super_QSharedData)->_q_value).
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_c8[0].d,1,0x10);
      }
    }
    pQVar7 = (tz->d).d;
    if (((((ulong)pQVar7 & 3) == 0) &&
        ((pQVar7 == (QTimeZonePrivate *)0x0 || (bVar3 = QTimeZonePrivate::isValid(pQVar7), !bVar3)))
        ) || (bVar3 = QTimeZone::hasDaylightTime(tz), bVar3)) {
LAB_00351d1a:
      QString::toUtf8_helper((QByteArray *)&local_c8[0].data,&local_48);
      QTimeZone::QTimeZone
                ((QTimeZone *)&local_b0.s,(QByteArray *)&local_c8[0].data,local_4c,
                 (QString *)&local_68.s,(QString *)&local_88.s,(Territory)local_8c,&local_a8);
      DVar1.s = *(ShortData *)&tz->d;
      tz->d = local_b0;
      local_b0.s = DVar1.s;
      QTimeZone::~QTimeZone((QTimeZone *)&local_b0.s);
      if (local_c8[0].d != (QDateTimePrivate *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&(local_c8[0].d)->super_QSharedData)->_q_value).
        super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&(local_c8[0].d)->super_QSharedData)->_q_value).
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&(local_c8[0].d)->super_QSharedData)->_q_value).
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_c8[0].d,1,0x10);
        }
      }
    }
    else {
      local_b0 = (Data)0x2;
      QDateTime::fromMSecsSinceEpoch((QDateTime *)&local_c8[0].data,0,(QTimeZone *)&local_b0.s);
      iVar4 = QTimeZone::offsetFromUtc(tz,(QDateTime *)&local_c8[0].data);
      qVar2 = local_4c;
      QDateTime::~QDateTime((QDateTime *)&local_c8[0].data);
      QTimeZone::~QTimeZone((QTimeZone *)&local_b0.s);
      if (iVar4 != qVar2) goto LAB_00351d1a;
    }
    if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_88.d != (QTimeZonePrivate *)0x0) {
      LOCK();
      *(int *)&(local_88.d)->_vptr_QTimeZonePrivate =
           *(int *)&(local_88.d)->_vptr_QTimeZonePrivate + -1;
      UNLOCK();
      if (*(int *)&(local_88.d)->_vptr_QTimeZonePrivate == 0) {
        QArrayData::deallocate((QArrayData *)local_88.d,2,0x10);
      }
    }
    if (local_68.d == (QTimeZonePrivate *)0x0) goto LAB_00351cb5;
    LOCK();
    *(int *)&(local_68.d)->_vptr_QTimeZonePrivate =
         *(int *)&(local_68.d)->_vptr_QTimeZonePrivate + -1;
    UNLOCK();
    if (*(int *)&(local_68.d)->_vptr_QTimeZonePrivate != 0) goto LAB_00351cb5;
    objectSize = 2;
    goto LAB_00351cab;
  case 0xe:
    rhs_01.m_data = "QTimeZone::UTC";
    rhs_01.m_size = 0xe;
    lhs_01.m_data = local_48.d.ptr;
    lhs_01.m_size = 0xe;
    bVar3 = QtPrivate::equalStrings(lhs_01,rhs_01);
    if (bVar3) {
      local_68.s = *(ShortData *)&tz->d;
      tz->d = (Data)0x2;
      goto LAB_00351ade;
    }
    break;
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
    break;
  case 0x14:
    rhs_02.m_data = "QTimeZone::LocalTime";
    rhs_02.m_size = 0x14;
    lhs_02.m_data = local_48.d.ptr;
    lhs_02.m_size = 0x14;
    bVar3 = QtPrivate::equalStrings(lhs_02,rhs_02);
    if (bVar3) {
      local_68.s = *(ShortData *)&tz->d;
      tz->d = (Data)0x1;
      goto LAB_00351ade;
    }
    break;
  default:
    if ((local_48.d.size == 0x18) &&
       (rhs_00.m_data = L"-No Time Zone Specified!", rhs_00.m_size = 0x18,
       lhs_00.m_data = local_48.d.ptr, lhs_00.m_size = 0x18,
       bVar3 = QtPrivate::equalStrings(lhs_00,rhs_00), bVar3)) {
      QTimeZone::QTimeZone((QTimeZone *)&local_68.s);
      DVar1.s = *(ShortData *)&tz->d;
      tz->d = local_68;
      local_68.s = DVar1.s;
      goto LAB_00351ade;
    }
  }
  QString::toUtf8_helper((QByteArray *)&local_68.s,&local_48);
  QTimeZone::QTimeZone((QTimeZone *)&local_88.s,(QByteArray *)&local_68.s);
  DVar1.s = *(ShortData *)&tz->d;
  tz->d = local_88;
  local_88.s = DVar1.s;
  QTimeZone::~QTimeZone((QTimeZone *)&local_88.s);
  if (local_68.d != (QTimeZonePrivate *)0x0) {
    LOCK();
    *(int *)&(local_68.d)->_vptr_QTimeZonePrivate =
         *(int *)&(local_68.d)->_vptr_QTimeZonePrivate + -1;
    UNLOCK();
    if (*(int *)&(local_68.d)->_vptr_QTimeZonePrivate == 0) {
      objectSize = 1;
LAB_00351cab:
      QArrayData::deallocate((QArrayData *)local_68.d,objectSize,0x10);
    }
  }
LAB_00351cb5:
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return ds;
}

Assistant:

QDataStream &operator>>(QDataStream &ds, QTimeZone &tz)
{
    QString ianaId;
    ds >> ianaId;
    // That may be various things other than actual IANA IDs:
    if (ianaId == invalidId()) {
        tz = QTimeZone();
    } else if (ianaId == "OffsetFromUtc"_L1) {
        int utcOffset;
        QString name;
        QString abbreviation;
        int territory;
        QString comment;
        ds >> ianaId >> utcOffset >> name >> abbreviation >> territory >> comment;
#if QT_CONFIG(timezone)
        // Try creating as a system timezone, which succeeds (producing a valid
        // zone) iff ianaId is valid; use this if it is a plain offset from UTC
        // zone, with the right offset, ignoring the other data:
        tz = QTimeZone(ianaId.toUtf8());
        if (!tz.isValid() || tz.hasDaylightTime()
            || tz.offsetFromUtc(QDateTime::fromMSecsSinceEpoch(0, QTimeZone::UTC)) != utcOffset) {
            // Construct a custom timezone using the saved values:
            tz = QTimeZone(ianaId.toUtf8(), utcOffset, name, abbreviation,
                           QLocale::Territory(territory), comment);
        }
#else
        tz = QTimeZone::fromSecondsAheadOfUtc(utcOffset);
#endif
    } else if (ianaId == "AheadOfUtcBy"_L1) {
        int utcOffset;
        ds >> utcOffset;
        tz = QTimeZone::fromSecondsAheadOfUtc(utcOffset);
    } else if (ianaId == "QTimeZone::UTC"_L1) {
        tz = QTimeZone(QTimeZone::UTC);
    } else if (ianaId == "QTimeZone::LocalTime"_L1) {
        tz = QTimeZone(QTimeZone::LocalTime);
#if QT_CONFIG(timezone)
    } else {
        tz = QTimeZone(ianaId.toUtf8());
#endif
    }
    return ds;
}